

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void wasm::
     CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::
     doEndLoop(CoalesceLocals *self,Expression **currp)

{
  LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *this;
  pointer *pppBVar1;
  BasicBlock *pBVar2;
  pointer ppBVar3;
  BasicBlock *__to;
  mapped_type *pmVar4;
  pointer ppBVar5;
  Loop *local_48;
  Loop *local_40;
  map<wasm::Expression_*,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
  *local_38;
  
  this = &(self->
          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
          ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>;
  pBVar2 = (self->
           super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
           ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
           super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
           .currBasicBlock;
  __to = startBasicBlock(&this->
                          super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                        );
  link(&this->
        super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
       ,(char *)pBVar2,(char *)__to);
  local_48 = Expression::cast<wasm::Loop>(*currp);
  if ((local_48->name).super_IString.str._M_str != (char *)0x0) {
    pBVar2 = (*(pointer *)
               ((long)&(self->
                       super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                       ).
                       super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                       .
                       super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                       .loopStack.
                       super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data + 8))[-1];
    local_38 = &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                ).
                super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                .
                super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                .branches;
    local_40 = local_48;
    pmVar4 = std::
             map<wasm::Expression_*,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
             ::operator[](local_38,(key_type *)&local_48);
    ppBVar3 = (pmVar4->
              super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppBVar5 = (pmVar4->
                   super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppBVar5 != ppBVar3;
        ppBVar5 = ppBVar5 + 1) {
      link(&this->
            super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
           ,(char *)*ppBVar5,(char *)pBVar2);
    }
    local_48 = local_40;
    std::
    _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>,_std::_Select1st<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
    ::erase(&local_38->_M_t,(key_type *)&local_48);
  }
  pppBVar1 = (pointer *)
             ((long)&(self->
                     super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                     ).
                     super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .
                     super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                     .loopStack.
                     super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data + 8);
  *pppBVar1 = *pppBVar1 + -1;
  return;
}

Assistant:

static void doEndLoop(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->link(last, self->startBasicBlock()); // fallthrough
    auto* curr = (*currp)->cast<Loop>();
    // branches to the top of the loop
    if (curr->name.is()) {
      auto* loopStart = self->loopStack.back();
      auto& origins = self->branches[curr];
      for (auto* origin : origins) {
        self->link(origin, loopStart);
      }
      self->branches.erase(curr);
    }
    self->loopStack.pop_back();
  }